

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

size_t __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::available
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this)

{
  size_t sVar1;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
  *in_RDI;
  size_t s;
  error_code ec;
  base_implementation_type *in_stack_ffffffffffffffc8;
  
  CLI::std::error_code::error_code((error_code *)in_RDI);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  get_service(in_RDI);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  get_implementation(in_RDI);
  sVar1 = asio::detail::reactive_socket_service_base::available
                    ((reactive_socket_service_base *)in_RDI,in_stack_ffffffffffffffc8,
                     (error_code *)0x4789ac);
  asio::detail::throw_error((error_code *)in_RDI,(char *)in_stack_ffffffffffffffc8);
  return sVar1;
}

Assistant:

std::size_t available() const
  {
    asio::error_code ec;
    std::size_t s = impl_.get_service().available(
        impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "available");
    return s;
  }